

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

cl_accelerator_intel
clCreateAcceleratorINTEL
          (cl_context context,cl_accelerator_type_intel accelerator_type,size_t descriptor_size,
          void *descriptor,cl_int *errcode_ret)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  ulong enqueueCounter;
  CLIntercept *this;
  byte bVar3;
  cl_platform_id p_Var4;
  mapped_type *pmVar5;
  cl_accelerator_intel accelerator;
  time_point end;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  cl_motion_estimation_desc_intel *desc;
  time_point local_78;
  cl_int localErrorCode;
  undefined1 local_58 [32];
  ulong local_38;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) goto LAB_00135f70;
  p_Var4 = CLIntercept::getPlatform(g_pIntercept,context);
  p_Var6 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var6 == (_Base_ptr)0x0) {
LAB_00135ecd:
    local_58._0_8_ = (key_type)0x0;
    pmVar5 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)local_58);
  }
  else {
    p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    do {
      if (*(cl_platform_id *)(p_Var6 + 1) >= p_Var4) {
        p_Var7 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[*(cl_platform_id *)(p_Var6 + 1) < p_Var4];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 == p_Var1) || (p_Var4 < *(cl_platform_id *)(p_Var7 + 1)))
    goto LAB_00135ecd;
    pmVar5 = (mapped_type *)&p_Var7[1]._M_parent;
  }
  if (pmVar5->clCreateAcceleratorINTEL ==
      (_func_cl_accelerator_intel_cl_context_cl_accelerator_type_intel_size_t_void_ptr_cl_int_ptr *)
      0x0) {
LAB_00135f70:
    if (errcode_ret != (cl_int *)0x0) {
      *errcode_ret = -0x22;
    }
    return (cl_accelerator_intel)0x0;
  }
  enqueueCounter = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  bVar2 = (this->m_Config).CallLogging;
  if (descriptor_size < 0x10 || accelerator_type != 0) {
    if (bVar2 != false) {
      CLIntercept::callLoggingEnter
                (this,"clCreateAcceleratorINTEL",enqueueCounter,(cl_kernel)0x0,
                 "context = %p, accelerator_type = %u",context,(ulong)accelerator_type);
    }
  }
  else if (bVar2 != false) {
    local_38 = (ulong)*(uint *)((long)descriptor + 4);
    CLIntercept::callLoggingEnter
              (this,"clCreateAcceleratorINTEL",enqueueCounter,(cl_kernel)0x0,
               "context = %p, motion_estimation_desc[ mb_block_type = %u, subpixel_mode = %u, sad_adjust_mode = %u, search_path_type = %u ]"
               ,context,(ulong)*descriptor,local_38,(ulong)*(uint *)((long)descriptor + 8),
               (ulong)*(uint *)((long)descriptor + 0xc));
  }
  localErrorCode = 0;
  if ((((this->m_Config).CallLogging == false) && ((this->m_Config).ErrorLogging == false)) &&
     ((this->m_Config).ErrorAssert == false)) {
    if ((errcode_ret == (cl_int *)0x0) && ((this->m_Config).NoErrors != false)) {
LAB_00135fe5:
      errcode_ret = &localErrorCode;
    }
  }
  else if (errcode_ret == (cl_int *)0x0) goto LAB_00135fe5;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_78.__d.__r = (duration)0;
  }
  else {
    local_78.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  accelerator = (*pmVar5->clCreateAcceleratorINTEL)
                          (context,accelerator_type,descriptor_size,descriptor,errcode_ret);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_58._0_8_ = (key_type)(local_58 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
      CLIntercept::updateHostTimingStats
                (this,"clCreateAcceleratorINTEL",(string *)local_58,local_78,end);
      if ((key_type)local_58._0_8_ != (key_type)(local_58 + 0x10)) {
        operator_delete((void *)local_58._0_8_);
      }
    }
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar3 = (this->m_Config).ErrorAssert;
    if ((((bool)bVar3 == false) && ((this->m_Config).NoErrors != true)) || (*errcode_ret == 0))
    goto LAB_00136126;
  }
  else {
    if (*errcode_ret == 0) goto LAB_00136126;
    CLIntercept::logError(this,"clCreateAcceleratorINTEL",*errcode_ret);
    bVar3 = (this->m_Config).ErrorAssert;
  }
  if ((bVar3 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors == true) {
    *errcode_ret = 0;
  }
LAB_00136126:
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clCreateAcceleratorINTEL",*errcode_ret,(cl_event *)0x0,(cl_sync_point_khr *)0x0
               ,"returned %p",accelerator);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_58._0_8_ = (key_type)(local_58 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
    CLIntercept::chromeCallLoggingExit
              (this,"clCreateAcceleratorINTEL",(string *)local_58,false,0,local_78,end);
    if ((key_type)local_58._0_8_ != (key_type)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_);
    }
  }
  if (accelerator == (cl_accelerator_intel)0x0) {
    return (cl_accelerator_intel)0x0;
  }
  CLIntercept::addAcceleratorInfo(this,accelerator,context);
  return accelerator;
}

Assistant:

CL_API_ENTRY cl_accelerator_intel CL_API_CALL clCreateAcceleratorINTEL(
    cl_context context,
    cl_accelerator_type_intel accelerator_type,
    size_t descriptor_size,
    const void* descriptor,
    cl_int* errcode_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(context);
        if( dispatchX.clCreateAcceleratorINTEL )
        {
            GET_ENQUEUE_COUNTER();

            if( ( accelerator_type == CL_ACCELERATOR_TYPE_MOTION_ESTIMATION_INTEL ) &&
                ( descriptor_size >= sizeof( cl_motion_estimation_desc_intel ) ) )
            {
                cl_motion_estimation_desc_intel* desc =
                    (cl_motion_estimation_desc_intel*)descriptor;
                CALL_LOGGING_ENTER( "context = %p, motion_estimation_desc[ mb_block_type = %u, subpixel_mode = %u, sad_adjust_mode = %u, search_path_type = %u ]",
                    context,
                    desc->mb_block_type,
                    desc->subpixel_mode,
                    desc->sad_adjust_mode,
                    desc->search_path_type );
            }
            else
            {
                CALL_LOGGING_ENTER( "context = %p, accelerator_type = %u",
                    context,
                    accelerator_type );
            }
            CHECK_ERROR_INIT( errcode_ret );
            HOST_PERFORMANCE_TIMING_START();

            cl_accelerator_intel retVal = dispatchX.clCreateAcceleratorINTEL(
                context,
                accelerator_type,
                descriptor_size,
                descriptor,
                errcode_ret);

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( errcode_ret[0] );
            //ADD_OBJECT_ALLOCATION( retVal );
            CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

            if( retVal != NULL )
            {
                pIntercept->addAcceleratorInfo(
                    retVal,
                    context );
            }

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}